

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

double * __thiscall
chaiscript::boxed_cast<double_const*>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  double *pdVar1;
  undefined8 *puVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  undefined8 *puVar6;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar7;
  Type_Info local_78;
  undefined *local_58;
  undefined *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78.m_type_info = (type_info *)&double_const*::typeinfo;
    local_78.m_bare_type_info = (type_info *)&double::typeinfo;
    local_78.m_flags = 5;
    bVar5 = Type_Info::bare_equal(*(Type_Info **)this,&local_78);
    t_conversions = extraout_RDX;
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<double_const*>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), t_conversions = extraout_RDX_00, bVar5)) {
      if ((bv != (Boxed_Value *)0x0) &&
         (bVar5 = Type_Conversions::convertable_type<double_const*>
                            ((Type_Conversions *)
                             (bv->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), bVar5)) {
        local_58 = &double_const*::typeinfo;
        local_50 = &double::typeinfo;
        local_48 = 5;
        BVar7 = Type_Conversions::boxed_type_conversion
                          ((Type_Conversions *)&local_78,
                           &((bv->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,(Conversion_Saves *)&local_58,
                           (Boxed_Value *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        pdVar1 = *(double **)(local_78.m_type_info + 0x28);
        detail::verify_type_no_throw<void>
                  ((Boxed_Value *)&local_78,(type_info *)&double::typeinfo,
                   BVar7.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.m_bare_type_info ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return pdVar1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.m_bare_type_info);
        return pdVar1;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      puVar2 = *(undefined8 **)this;
      local_78._16_8_ = puVar2[2];
      ptVar3 = (type_info *)*puVar2;
      ptVar4 = (type_info *)puVar2[1];
      *puVar6 = &PTR__bad_cast_0019ca28;
      local_78.m_type_info._0_4_ = SUB84(ptVar3,0);
      local_78.m_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      local_78.m_bare_type_info._0_4_ = SUB84(ptVar4,0);
      local_78.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_78.m_type_info._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_78.m_type_info._4_4_;
      *(undefined4 *)(puVar6 + 2) = local_78.m_bare_type_info._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = local_78.m_bare_type_info._4_4_;
      puVar6[3] = local_78._16_8_;
      puVar6[4] = &double_const*::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_78.m_type_info = ptVar3;
      local_78.m_bare_type_info = ptVar4;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  pdVar1 = *(double **)(*(long *)this + 0x28);
  detail::verify_type_no_throw<void>
            ((Boxed_Value *)this,(type_info *)&double::typeinfo,t_conversions);
  return pdVar1;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }